

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<double,long,std::vector<double,std::allocator<double>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  reference pvVar7;
  long lVar8;
  long *plVar9;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  double extraout_XMM0_Qa;
  double __value;
  double __value_00;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double __x;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double dVar15;
  double extraout_XMM0_Qa_07;
  double __value_01;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  long in_stack_00000008;
  int in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  longdouble out;
  longdouble v;
  longdouble sn;
  size_t *row_2;
  size_t *row_1;
  longdouble xval;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  size_t row;
  longdouble cnt;
  longdouble w_this;
  longdouble x_sq;
  longdouble s4;
  longdouble s3;
  longdouble s2;
  longdouble s1;
  undefined2 in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe92;
  unsigned_long *in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea2;
  long *in_stack_fffffffffffffeb0;
  undefined2 uVar16;
  undefined2 in_stack_fffffffffffffec2;
  undefined1 uVar17;
  undefined1 in_stack_fffffffffffffec5;
  byte in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  size_t in_stack_fffffffffffffec8;
  size_t *ix_arr_00;
  unkbyte10 in_stack_fffffffffffffed8;
  long *local_118;
  undefined2 uVar18;
  undefined6 in_stack_fffffffffffffef2;
  ulong *local_f8;
  ulong *local_f0;
  long local_c8;
  ulong local_b0;
  longdouble local_a8;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  double local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = -INFINITY;
  }
  else {
    local_78 = (longdouble)0;
    local_a8 = local_78;
    for (local_b0 = in_RSI; local_b0 <= in_RDX; local_b0 = local_b0 + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000018,*(size_type *)(in_RDI + local_b0 * 8));
      local_a8 = local_a8 + (longdouble)*pvVar7;
    }
    if ((longdouble)0 < local_a8) {
      local_c8 = *(long *)(in_stack_00000008 + in_RCX * 8);
      lVar2 = *(long *)(in_stack_00000008 + 8 + in_RCX * 8);
      lVar8 = lVar2 + -1;
      uVar3 = *(ulong *)(in_R9 + lVar8 * 8);
      local_f8 = std::lower_bound<unsigned_long*,long>
                           ((unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0),
                            in_stack_fffffffffffffe98,
                            (long *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
      dVar15 = extraout_XMM0_Qa;
      local_f0 = local_f8;
      local_68 = local_78;
      local_58 = local_78;
      local_48 = local_78;
      if (in_stack_00000010 == 0) {
        while( true ) {
          lVar11 = in_ST3;
          lVar13 = in_ST2;
          lVar12 = in_ST1;
          ix_arr_00 = (size_t *)in_stack_fffffffffffffed8;
          in_stack_fffffffffffffec5 = false;
          if ((local_f8 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (in_stack_fffffffffffffec5 = false, local_c8 != lVar2)) {
            in_stack_fffffffffffffec5 = *local_f8 <= uVar3;
          }
          if ((bool)in_stack_fffffffffffffec5 == false) break;
          if (*(ulong *)(in_R9 + local_c8 * 8) == *local_f8) {
            std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,*local_f8);
            lVar10 = (longdouble)*(double *)(in_R8 + local_c8 * 8);
            lVar10 = lVar10 * lVar10;
            in_ST1 = in_ST4;
            dVar15 = std::fma(__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_ST2 = in_ST1;
            dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_ST3 = in_ST2;
            dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_stack_fffffffffffffe98 = SUB108(local_78,0);
            in_stack_fffffffffffffea0 = (undefined2)((unkuint10)local_78 >> 0x40);
            in_stack_fffffffffffffe90 = (undefined2)((unkuint10)(lVar10 * lVar10) >> 0x40);
            lVar10 = in_ST3;
            dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            ix_arr_00 = (size_t *)in_stack_fffffffffffffed8;
            local_78 = lVar11;
            local_68 = lVar13;
            local_58 = lVar12;
            local_48 = in_ST0;
            if ((local_f8 == (ulong *)(in_RDI + in_RDX * 8)) || (local_c8 == lVar8)) break;
            local_f8 = local_f8 + 1;
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0
                                                ),(long *)in_stack_fffffffffffffe98,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
            local_c8 = (long)plVar9 - in_R9 >> 3;
            in_ST0 = in_ST4;
            in_ST4 = lVar10;
            dVar15 = extraout_XMM0_Qa_04;
          }
          else if ((long)*local_f8 < *(long *)(in_R9 + local_c8 * 8)) {
            local_f8 = std::lower_bound<unsigned_long*,long>
                                 ((unsigned_long *)
                                  CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0),
                                  in_stack_fffffffffffffe98,
                                  (long *)CONCAT62(in_stack_fffffffffffffe92,
                                                   in_stack_fffffffffffffe90));
            in_ST1 = lVar12;
            in_ST2 = lVar13;
            in_ST3 = lVar11;
            dVar15 = extraout_XMM0_Qa_05;
          }
          else {
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0
                                                ),(long *)in_stack_fffffffffffffe98,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
            local_c8 = (long)plVar9 - in_R9 >> 3;
            in_ST1 = lVar12;
            in_ST2 = lVar13;
            in_ST3 = lVar11;
            dVar15 = extraout_XMM0_Qa_06;
          }
        }
      }
      else {
        while( true ) {
          ix_arr_00 = (size_t *)in_stack_fffffffffffffed8;
          in_stack_fffffffffffffec7 = false;
          if ((local_f0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (in_stack_fffffffffffffec7 = false, local_c8 != lVar2)) {
            in_stack_fffffffffffffec7 = *local_f0 <= uVar3;
          }
          if ((bool)in_stack_fffffffffffffec7 == false) break;
          if (*(ulong *)(in_R9 + local_c8 * 8) == *local_f0) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_00000018,*local_f0);
            dVar1 = *pvVar7;
            lVar12 = (longdouble)*(double *)(in_R8 + local_c8 * 8);
            uVar6 = std::isnan(__value);
            in_stack_fffffffffffffec6 = 1;
            dVar15 = __value_00;
            if ((uVar6 & 1) == 0) {
              iVar5 = std::isinf(__value_00);
              in_stack_fffffffffffffec6 = (byte)iVar5;
              dVar15 = extraout_XMM0_Qa_00;
            }
            if ((in_stack_fffffffffffffec6 & 1) == 0) {
              lVar12 = lVar12 * lVar12;
              lVar13 = in_ST4;
              dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              lVar11 = lVar13;
              dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              lVar10 = lVar11;
              dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              in_stack_fffffffffffffe98 = SUB108(local_78,0);
              in_stack_fffffffffffffea0 = (undefined2)((unkuint10)local_78 >> 0x40);
              in_stack_fffffffffffffe90 = (undefined2)((unkuint10)(lVar12 * lVar12) >> 0x40);
              lVar14 = lVar10;
              dVar15 = std::fma(dVar15,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              lVar12 = in_ST4;
              in_ST4 = lVar14;
              local_78 = in_ST3;
              local_68 = in_ST2;
              local_58 = in_ST1;
              local_48 = in_ST0;
            }
            else {
              local_a8 = local_a8 - (longdouble)dVar1;
              lVar12 = in_ST0;
              lVar13 = in_ST1;
              lVar11 = in_ST2;
              lVar10 = in_ST3;
            }
            ix_arr_00 = (size_t *)in_stack_fffffffffffffed8;
            if ((local_f0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_c8 == lVar8)) break;
            local_f0 = local_f0 + 1;
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0
                                                ),(long *)in_stack_fffffffffffffe98,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
            local_c8 = (long)plVar9 - in_R9 >> 3;
            in_ST0 = lVar12;
            in_ST1 = lVar13;
            in_ST2 = lVar11;
            in_ST3 = lVar10;
            dVar15 = extraout_XMM0_Qa_01;
          }
          else if ((long)*local_f0 < *(long *)(in_R9 + local_c8 * 8)) {
            local_f0 = std::lower_bound<unsigned_long*,long>
                                 ((unsigned_long *)
                                  CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0),
                                  in_stack_fffffffffffffe98,
                                  (long *)CONCAT62(in_stack_fffffffffffffe92,
                                                   in_stack_fffffffffffffe90));
            dVar15 = extraout_XMM0_Qa_02;
          }
          else {
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0
                                                ),(long *)in_stack_fffffffffffffe98,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
            local_c8 = (long)plVar9 - in_R9 >> 3;
            dVar15 = extraout_XMM0_Qa_03;
          }
        }
        if (local_a8 <= (longdouble)0) {
          return -INFINITY;
        }
      }
      uVar17 = true;
      if ((longdouble)1 < local_a8) {
        uVar17 = true;
        if ((local_58 != (longdouble)0) || (NAN(local_58) || NAN((longdouble)0))) {
          uVar17 = local_48 * local_48 == local_58;
        }
      }
      if ((bool)uVar17 == false) {
        lVar12 = local_48 / local_a8;
        lVar13 = local_58 / local_a8 - lVar12 * lVar12;
        local_118 = SUB108(lVar13,0);
        uVar16 = (undefined2)((unkuint10)lVar13 >> 0x40);
        uVar6 = std::isnan(dVar15);
        if ((uVar6 & 1) == 0) {
          plVar9 = local_118;
          uVar18 = uVar16;
          dVar15 = std::numeric_limits<double>::epsilon();
          if (((longdouble)dVar15 < (longdouble)CONCAT28(uVar16,plVar9)) ||
             (bVar4 = check_more_than_two_unique_values<double,long>
                                (ix_arr_00,(size_t)dVar15,in_stack_fffffffffffffec8,
                                 CONCAT17(in_stack_fffffffffffffec7,
                                          CONCAT16(in_stack_fffffffffffffec6,
                                                   CONCAT15(in_stack_fffffffffffffec5,
                                                            CONCAT14(uVar17,CONCAT22(
                                                  in_stack_fffffffffffffec2,uVar16))))),plVar9,
                                 in_stack_fffffffffffffeb0,
                                 (double *)CONCAT62(in_stack_fffffffffffffef2,uVar18),
                                 SUB104(lVar12,0)), dVar15 = extraout_XMM0_Qa_07, bVar4)) {
            if ((longdouble)CONCAT28(uVar18,local_118) <= (longdouble)0) {
              local_8 = 0.0;
            }
            else {
              lVar13 = lVar12 * lVar12 * lVar12;
              lVar12 = (lVar13 * lVar12 * local_a8 +
                       (((longdouble)6.0 * local_58 * lVar12 * lVar12 +
                        (local_78 - local_68 * (longdouble)4.0 * lVar12)) -
                       local_48 * (longdouble)4.0 * lVar13)) /
                       ((longdouble)CONCAT28(uVar18,local_118) *
                        (longdouble)CONCAT28(uVar18,local_118) * local_a8);
              uVar6 = std::isnan(dVar15);
              if (((uVar6 & 1) == 0) && (uVar6 = std::isinf(__value_01), (uVar6 & 1) == 0)) {
                local_8 = (double)lVar12;
                if (local_8 <= 0.0) {
                  local_8 = 0.0;
                }
              }
              else {
                local_8 = -INFINITY;
              }
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
      else {
        local_8 = -INFINITY;
      }
    }
    else {
      local_8 = -INFINITY;
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}